

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O3

void slang::signExtend(uint64_t *input,uint32_t numWords,uint32_t word,uint32_t bit,
                      uint64_t topWordMask)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  if ((input[word] >> ((ulong)bit & 0x3f) & 1) != 0) {
    uVar1 = numWords - 1;
    if (word < uVar1) {
      input[uVar1] = topWordMask;
      uVar3 = numWords - 2;
      topWordMask = 0xffffffffffffffff;
      numWords = uVar1;
      uVar1 = uVar3;
    }
    if (word < uVar1) {
      uVar2 = (ulong)((numWords - word) - 2);
      memset(input + (uVar1 - uVar2),0xff,uVar2 * 8 + 8);
    }
    uVar2 = 0xffffffffffffffff;
    if (uVar1 == word) {
      uVar2 = topWordMask;
    }
    input[word] = input[word] | (uVar2 >> ((byte)bit & 0x3f)) << ((byte)bit & 0x3f);
  }
  return;
}

Assistant:

static void signExtend(uint64_t* input, uint32_t numWords, uint32_t word, uint32_t bit,
                       uint64_t topWordMask) {
    if ((input[word] & (1ULL << bit)) == 0)
        return; // If word.bit is zero, don't change anything.

    if (numWords - 1 > word) {
        input[numWords - 1] = topWordMask;
        numWords--;
        topWordMask = UINT64_MAX;
    }

    uint64_t mask = UINT64_MAX;
    for (auto i = numWords - 1; i > word; i--)
        input[i] = mask;

    mask <<= bit;
    if (numWords - 1 == word)
        mask &= topWordMask;
    input[word] |= mask;
}